

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O0

bool __thiscall QLocalSocket::waitForConnected(QLocalSocket *this,int msec)

{
  LocalSocketState LVar1;
  int iVar2;
  QLocalSocketPrivate *str;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  int result;
  QLocalSocketPrivate *d;
  nanoseconds remainingTime;
  QDeadlineTimer deadline;
  pollfd pfd;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff50;
  short in_stack_ffffffffffffff52;
  undefined2 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  QLocalSocketPrivate *in_stack_ffffffffffffff58;
  undefined1 auVar4 [12];
  QLocalSocketPrivate *pQVar5;
  undefined4 in_stack_ffffffffffffff88;
  bool local_61;
  undefined1 local_20 [8];
  QLocalSocketPrivate *local_18;
  pollfd local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str = d_func((QLocalSocket *)0x3893e4);
  LVar1 = state((QLocalSocket *)
                CONCAT17(in_stack_ffffffffffffff57,
                         CONCAT16(in_stack_ffffffffffffff56,
                                  CONCAT24(in_stack_ffffffffffffff54,
                                           CONCAT22(in_stack_ffffffffffffff52,
                                                    in_stack_ffffffffffffff50)))));
  if (LVar1 == ConnectingState) {
    local_10.fd = -0x55555556;
    local_10.events = -0x5556;
    local_10.revents = -0x5556;
    local_10 = qt_make_pollfd(CONCAT13(in_stack_ffffffffffffff57,
                                       CONCAT12(in_stack_ffffffffffffff56,in_stack_ffffffffffffff54)
                                      ),in_stack_ffffffffffffff52);
    local_20 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
    local_18 = (QLocalSocketPrivate *)0xaaaaaaaaaaaaaaaa;
    QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_20,(long)in_ESI,CoarseTimer);
    QDeadlineTimer::remainingTimeAsDuration((QDeadlineTimer *)in_stack_ffffffffffffff58);
    do {
      pQVar5 = local_18;
      iVar2 = qt_safe_poll(&local_10,1,(QDeadlineTimer *)local_20);
      if (iVar2 == -1) {
        pQVar5 = str;
        QVar3 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)str,
                           CONCAT17(in_stack_ffffffffffffff57,
                                    CONCAT16(in_stack_ffffffffffffff56,
                                             CONCAT24(in_stack_ffffffffffffff54,
                                                      CONCAT22(in_stack_ffffffffffffff52,
                                                               in_stack_ffffffffffffff50)))));
        auVar4 = QVar3._4_12_;
        QVar3.m_data._0_4_ = in_stack_ffffffffffffff88;
        QVar3.m_size = (qsizetype)pQVar5;
        QVar3.m_data._4_4_ = in_ESI;
        QString::QString(in_RDI,QVar3);
        QLocalSocketPrivate::setErrorAndEmit(auVar4._4_8_,auVar4._0_4_,in_RDI);
        QString::~QString((QString *)0x38953c);
        in_stack_ffffffffffffff58 = str;
        str = pQVar5;
      }
      else if (0 < iVar2) {
        QLocalSocketPrivate::_q_connectToSocket(pQVar5);
      }
      LVar1 = state((QLocalSocket *)
                    CONCAT17(in_stack_ffffffffffffff57,
                             CONCAT16(in_stack_ffffffffffffff56,
                                      CONCAT24(in_stack_ffffffffffffff54,
                                               CONCAT22(in_stack_ffffffffffffff52,
                                                        in_stack_ffffffffffffff50)))));
      in_stack_ffffffffffffff57 = false;
      if (LVar1 == ConnectingState) {
        QDeadlineTimer::remainingTimeAsDuration((QDeadlineTimer *)in_stack_ffffffffffffff58);
        ns<(char)48>();
        in_stack_ffffffffffffff57 =
             std::chrono::operator>
                       ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                        CONCAT17(in_stack_ffffffffffffff57,
                                 CONCAT16(in_stack_ffffffffffffff56,
                                          CONCAT24(in_stack_ffffffffffffff54,
                                                   CONCAT22(in_stack_ffffffffffffff52,
                                                            in_stack_ffffffffffffff50)))),
                        in_stack_ffffffffffffff48);
      }
    } while ((bool)in_stack_ffffffffffffff57 != false);
    LVar1 = state((QLocalSocket *)
                  (ulong)CONCAT16(in_stack_ffffffffffffff56,
                                  CONCAT24(in_stack_ffffffffffffff54,
                                           CONCAT22(in_stack_ffffffffffffff52,
                                                    in_stack_ffffffffffffff50))));
  }
  else {
    LVar1 = state((QLocalSocket *)
                  CONCAT17(in_stack_ffffffffffffff57,
                           CONCAT16(in_stack_ffffffffffffff56,
                                    CONCAT24(in_stack_ffffffffffffff54,
                                             CONCAT22(in_stack_ffffffffffffff52,
                                                      in_stack_ffffffffffffff50)))));
  }
  local_61 = LVar1 == ConnectedState;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool QLocalSocket::waitForConnected(int msec)
{
    Q_D(QLocalSocket);

    if (state() != ConnectingState)
        return (state() == ConnectedState);

    pollfd pfd = qt_make_pollfd(d->connectingSocket, POLLIN);

    QDeadlineTimer deadline{msec};
    auto remainingTime = deadline.remainingTimeAsDuration();

    do {
        const int result = qt_safe_poll(&pfd, 1, deadline);
        if (result == -1)
            d->setErrorAndEmit(QLocalSocket::UnknownSocketError,
                               "QLocalSocket::waitForConnected"_L1);
        else if (result > 0)
            d->_q_connectToSocket();
    } while (state() == ConnectingState
             && (remainingTime = deadline.remainingTimeAsDuration()) > 0ns);

    return (state() == ConnectedState);
}